

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_MapEntryKeyTypeBytes_Test::
~ValidationErrorTest_MapEntryKeyTypeBytes_Test(ValidationErrorTest_MapEntryKeyTypeBytes_Test *this)

{
  ValidationErrorTest_MapEntryKeyTypeBytes_Test *this_local;
  
  ~ValidationErrorTest_MapEntryKeyTypeBytes_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, MapEntryKeyTypeBytes) {
  FileDescriptorProto file_proto;
  FillValidMapEntry(&file_proto);
  FieldDescriptorProto* key =
      file_proto.mutable_message_type(0)->mutable_nested_type(0)->mutable_field(
          0);
  key->set_type(FieldDescriptorProto::TYPE_BYTES);
  BuildFileWithErrors(file_proto, kMapEntryKeyTypeErrorMessage);
}